

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

QSize __thiscall QToolButton::sizeHint(QToolButton *this)

{
  bool bVar1;
  int iVar2;
  QToolButtonPrivate *this_00;
  QStyle *pQVar3;
  QStyleOptionToolButton *this_01;
  QRect *in_RDI;
  long in_FS_OFFSET;
  int h;
  int w;
  QToolButtonPrivate *d;
  QSize textSize;
  QSize icon;
  QFontMetrics fm;
  QStyleOptionToolButton opt;
  QWidget *in_stack_fffffffffffffec8;
  QSize *in_stack_fffffffffffffed0;
  QAbstractButton *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int local_110;
  int local_10c;
  undefined1 local_f4 [8];
  QSize local_ec;
  QChar local_da;
  undefined1 local_d8 [24];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  QSize local_a8;
  undefined1 local_a0 [88];
  undefined8 local_48;
  int local_24;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QToolButton *)0x7094e0);
  bVar1 = QSize::isValid((QSize *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if (bVar1) {
    local_a8 = (this_00->super_QAbstractButtonPrivate).sizeHint;
  }
  else {
    QWidget::ensurePolished((QWidget *)this_00);
    local_10c = 0;
    local_110 = 0;
    memset(local_a0,0xaa,0x98);
    QStyleOptionToolButton::QStyleOptionToolButton((QStyleOptionToolButton *)0x709553);
    (**(code **)(*(long *)in_RDI + 0x1b8))(in_RDI,local_a0);
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics(in_stack_fffffffffffffec8);
    if (local_24 != 1) {
      local_b8 = local_48;
      local_10c = QSize::width((QSize *)0x7095c0);
      local_110 = QSize::height((QSize *)0x7095d1);
    }
    if (local_24 != 0) {
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      QAbstractButton::text(in_stack_fffffffffffffed8);
      local_c0 = (undefined1 *)
                 QFontMetrics::size((int)&local_b0,(QString *)0x800,(int)local_d8,(int *)0x0);
      QString::~QString((QString *)0x70962b);
      in_stack_fffffffffffffee4 = QSize::width((QSize *)0x709635);
      QChar::QChar<char16_t,_true>(&local_da,L' ');
      QFontMetrics::horizontalAdvance((QChar *)&local_b0);
      QSize::setWidth(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      if (local_24 == 3) {
        QSize::height((QSize *)0x709680);
        iVar2 = QSize::width((QSize *)0x709695);
        if (local_10c < iVar2) {
          QSize::width((QSize *)0x7096a5);
        }
      }
      else if (local_24 == 2) {
        QSize::width((QSize *)0x7096bf);
        iVar2 = QSize::height((QSize *)0x7096d4);
        if (local_110 < iVar2) {
          QSize::height((QSize *)0x7096e4);
        }
      }
      else {
        QSize::width((QSize *)0x7096f4);
        QSize::height((QSize *)0x709702);
      }
    }
    QSize::QSize(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (int)in_stack_fffffffffffffec8);
    QRect::setSize(in_RDI,(QSize *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (this_00->popupMode == MenuButtonPopup) {
      pQVar3 = QWidget::style(in_stack_fffffffffffffec8);
      (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,2,local_a0,in_RDI);
    }
    this_01 = (QStyleOptionToolButton *)QWidget::style(in_stack_fffffffffffffec8);
    QSize::QSize((QSize *)this_01,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (int)in_stack_fffffffffffffec8);
    local_ec = (QSize)(**(code **)(*(long *)&(this_01->super_QStyleOptionComplex).super_QStyleOption
                                  + 0xe8))(this_01,3,local_a0,local_f4,in_RDI);
    (this_00->super_QAbstractButtonPrivate).sizeHint = local_ec;
    local_a8 = (this_00->super_QAbstractButtonPrivate).sizeHint;
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_b0);
    QStyleOptionToolButton::~QStyleOptionToolButton(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a8;
}

Assistant:

QSize QToolButton::sizeHint() const
{
    Q_D(const QToolButton);
    if (d->sizeHint.isValid())
        return d->sizeHint;
    ensurePolished();

    int w = 0, h = 0;
    QStyleOptionToolButton opt;
    initStyleOption(&opt);

    QFontMetrics fm = fontMetrics();
    if (opt.toolButtonStyle != Qt::ToolButtonTextOnly) {
        QSize icon = opt.iconSize;
        w = icon.width();
        h = icon.height();
    }

    if (opt.toolButtonStyle != Qt::ToolButtonIconOnly) {
        QSize textSize = fm.size(Qt::TextShowMnemonic, text());
        textSize.setWidth(textSize.width() + fm.horizontalAdvance(u' ') * 2);
        if (opt.toolButtonStyle == Qt::ToolButtonTextUnderIcon) {
            h += 4 + textSize.height();
            if (textSize.width() > w)
                w = textSize.width();
        } else if (opt.toolButtonStyle == Qt::ToolButtonTextBesideIcon) {
            w += 4 + textSize.width();
            if (textSize.height() > h)
                h = textSize.height();
        } else { // TextOnly
            w = textSize.width();
            h = textSize.height();
        }
    }

    opt.rect.setSize(QSize(w, h)); // PM_MenuButtonIndicator depends on the height
    if (d->popupMode == MenuButtonPopup)
        w += style()->pixelMetric(QStyle::PM_MenuButtonIndicator, &opt, this);

    d->sizeHint = style()->sizeFromContents(QStyle::CT_ToolButton, &opt, QSize(w, h), this);
    return d->sizeHint;
}